

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::InternalAppender::FlushInternal(InternalAppender *this,ColumnDataCollection *collection)

{
  int iVar1;
  Binder *this_00;
  undefined4 extraout_var;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  undefined1 local_40 [40];
  
  Binder::CreateBinder
            ((Binder *)local_40,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER
            );
  this_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_40);
  Binder::BindConstraints
            ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)(local_40 + 0x10),this_00,this->table);
  iVar1 = (*(this->table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
            _vptr_CatalogEntry[0x10])();
  DataTable::LocalAppend
            ((DataTable *)CONCAT44(extraout_var,iVar1),this->table,this->context,collection,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)(local_40 + 0x10),
             (optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>)0x0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             *)(local_40 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  return;
}

Assistant:

void InternalAppender::FlushInternal(ColumnDataCollection &collection) {
	auto binder = Binder::CreateBinder(context);
	auto bound_constraints = binder->BindConstraints(table);
	table.GetStorage().LocalAppend(table, context, collection, bound_constraints, nullptr);
}